

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::
from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vec,
          _func_ConversionResult_unsigned_short_ptr_ptr_unsigned_short_ptr_uchar_ptr_ptr_uchar_ptr_ConversionFlags
          *conversionFn)

{
  UTF8 *pUVar1;
  ConversionResult CVar2;
  string *psVar3;
  undefined4 *puVar4;
  UTF8 *targetStart_out;
  unsigned_short *sourceStart;
  ostringstream ss;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  UTF8 *local_1b0;
  UTF16 *local_1a8;
  ostringstream local_1a0 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             ((char)*(undefined8 *)(this + 8) - (char)*(undefined8 *)this) * '\x02');
  local_1a8 = *(UTF16 **)this;
  pUVar1 = (UTF8 *)(__return_storage_ptr__->_M_dataplus)._M_p;
  local_1b0 = pUVar1;
  CVar2 = convertUTF::ConvertUTF16toUTF8
                    (&local_1a8,*(UTF16 **)(this + 8),&local_1b0,
                     pUVar1 + __return_storage_ptr__->_M_string_length,strictConversion);
  if (CVar2 == conversionOK) {
    psVar3 = (string *)
             std::__cxx11::string::resize
                       ((ulong)__return_storage_ptr__,(char)local_1b0 - (char)pUVar1);
    return psVar3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Cannot convert string : invalid source text",0x2b);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 3;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1d0 == &local_1c0) {
    puVar4[6] = local_1c0;
    puVar4[7] = uStack_1bc;
    puVar4[8] = uStack_1b8;
    puVar4[9] = uStack_1b4;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1d0;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1bc,local_1c0);
  }
  *(undefined8 *)(puVar4 + 4) = local_1c8;
  local_1c0 = local_1c0 & 0xffffff00;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

std::string from_utf_nn(std::vector<InputType> &&vec, F conversionFn)
{
    std::string rv;
    rv.resize(vec.size() * 4);
    const InputType *sourceStart = vec.data();
    auto sourceEnd = sourceStart + vec.size();
    const auto targetStart = reinterpret_cast<UTF8 *>(rv.data());
    auto targetStart_out = targetStart;
    auto targetEnd = targetStart + rv.size();
    auto result = conversionFn(&sourceStart, sourceEnd, &targetStart_out, targetEnd, ConversionFlags::strictConversion);
    if (result != ConversionResult::conversionOK)
    {
        THROW(ERR_COMMON, "Cannot convert string : invalid source text")
    }
    rv.resize(targetStart_out - targetStart);
    return rv;
}